

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundQueryNode *node)

{
  InternalException *this_00;
  BoundQueryNode *in_RDX;
  string local_40;
  
  switch(in_RDX->type) {
  case SELECT_NODE:
    BoundQueryNode::Cast<duckdb::BoundSelectNode>(in_RDX);
    CreatePlan(this,(BoundSelectNode *)node);
    break;
  case SET_OPERATION_NODE:
    BoundQueryNode::Cast<duckdb::BoundSetOperationNode>(in_RDX);
    CreatePlan(this,(BoundSetOperationNode *)node);
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unsupported bound query node type","");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case RECURSIVE_CTE_NODE:
    BoundQueryNode::Cast<duckdb::BoundRecursiveCTENode>(in_RDX);
    CreatePlan(this,(BoundRecursiveCTENode *)node);
    break;
  case CTE_NODE:
    BoundQueryNode::Cast<duckdb::BoundCTENode>(in_RDX);
    CreatePlan(this,(BoundCTENode *)node);
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundQueryNode &node) {
	switch (node.type) {
	case QueryNodeType::SELECT_NODE:
		return CreatePlan(node.Cast<BoundSelectNode>());
	case QueryNodeType::SET_OPERATION_NODE:
		return CreatePlan(node.Cast<BoundSetOperationNode>());
	case QueryNodeType::RECURSIVE_CTE_NODE:
		return CreatePlan(node.Cast<BoundRecursiveCTENode>());
	case QueryNodeType::CTE_NODE:
		return CreatePlan(node.Cast<BoundCTENode>());
	default:
		throw InternalException("Unsupported bound query node type");
	}
}